

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int ffh_pairs(lua_State *L,MMS mm)

{
  TValue *pTVar1;
  cTValue *L_00;
  int in_ESI;
  long in_RDI;
  cTValue *mo;
  TValue *o;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  lua_State *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar2;
  lua_State *in_stack_ffffffffffffff58;
  
  pTVar1 = lj_lib_checkany(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  L_00 = lj_meta_lookup(in_stack_ffffffffffffff58,
                        (cTValue *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        (MMS)((ulong)in_RDI >> 0x20));
  if (((pTVar1->field_2).it == 0xfffffff5) && ((L_00->field_2).it != 0xffffffff)) {
    *(TValue **)(in_RDI + 0x18) = pTVar1 + 1;
    ((cTValue *)(*(long *)(in_RDI + 0x10) + -8))->field_2 =
         *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)L_00;
    iVar2 = -1;
  }
  else {
    if ((pTVar1->field_2).it != 0xfffffff4) {
      lj_err_argt((lua_State *)&L_00->field_2,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    }
    pTVar1[-1].field_2.field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x20);
    *(undefined4 *)((long)pTVar1 + -4) = 0xfffffff7;
    if (in_ESI == 0x14) {
      *(undefined4 *)((long)pTVar1 + 0xc) = 0xffffffff;
    }
    else {
      pTVar1[1].u64 = 0;
    }
    iVar2 = 4;
  }
  return iVar2;
}

Assistant:

static int ffh_pairs(lua_State *L, MMS mm)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo = lj_meta_lookup(L, o, mm);
  if ((LJ_52 || tviscdata(o)) && !tvisnil(mo)) {
    L->top = o+1;  /* Only keep one argument. */
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    if (!tvistab(o)) lj_err_argt(L, 1, LUA_TTABLE);
    if (LJ_FR2) { copyTV(L, o-1, o); o--; }
    setfuncV(L, o-1, funcV(lj_lib_upvalue(L, 1)));
    if (mm == MM_pairs) setnilV(o+1); else setintV(o+1, 0);
    return FFH_RES(3);
  }
}